

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

int proxy_process(proxy_handle *ph)

{
  void *pvVar1;
  conn_handle *conn_00;
  char local_78 [8];
  char remote_addr [54];
  int local_34;
  proxy_worker *ppStack_30;
  int ret;
  proxy_worker *worker;
  conn_handle *conn;
  proxy_priv *priv;
  proxy_handle *ph_local;
  
  pvVar1 = ph->priv;
  ppStack_30 = (proxy_worker *)0x0;
  memset(local_78,0,0x36);
  conn_00 = (conn_handle *)calloc(1,0x20);
  if (conn_00 == (conn_handle *)0x0) {
    ph_local._4_4_ = -0xc;
  }
  else {
    ph_local._4_4_ = conn_init(conn_00);
    if (ph_local._4_4_ < 0) {
      free(conn_00);
    }
    else {
      proxy_log(ph,LOG_LEVEL_DEBUG,"Waiting for a client...\n");
      local_34 = conn_accept((conn_handle *)((long)pvVar1 + 0x840),conn_00);
      if (-1 < local_34) {
        conn_get_remote_addr(conn_00,local_78);
        proxy_log(ph,LOG_LEVEL_DEBUG,"Incoming connection from %s.\n",local_78);
        mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x870));
        mutex_lock((mutex_handle *)((long)pvVar1 + 0x880));
        if ((0 < *(int *)((long)pvVar1 + 0x83c)) && (*(long *)((long)pvVar1 + 0x820) != 0)) {
          ppStack_30 = *(proxy_worker **)((long)pvVar1 + 0x820);
          *(proxy_worker **)((long)pvVar1 + 0x820) = ppStack_30->next;
        }
        mutex_unlock((mutex_handle *)((long)pvVar1 + 0x880));
        mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x870));
        if (ppStack_30 == (proxy_worker *)0x0) {
          proxy_log(ph,LOG_LEVEL_INFO,"Dropping client because there are no available slots.\n");
          local_34 = 0;
        }
        else {
          local_34 = proxy_worker_accept(ppStack_30,conn_00);
          if (-1 < local_34) {
            return 0;
          }
        }
      }
      conn_free(conn_00);
      free(conn_00);
      ph_local._4_4_ = local_34;
    }
  }
  return ph_local._4_4_;
}

Assistant:

int proxy_process(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	struct conn_handle *conn;
	struct proxy_worker *worker = NULL;
	int ret = -EBUSY;
	char remote_addr[54] = { 0 };

	conn = calloc(1, sizeof(*conn));
	if (conn == NULL)
		return -ENOMEM;

	ret = conn_init(conn);
	if (ret < 0) {
		free(conn);
		return ret;
	}

	proxy_log(ph, LOG_LEVEL_DEBUG, "Waiting for a client...\n");

	ret = conn_accept(&priv->conn_listen, conn);
	if (ret < 0)
		goto conn_process_exit;

	conn_get_remote_addr(conn, remote_addr);
	proxy_log(ph, LOG_LEVEL_DEBUG, "Incoming connection from %s.\n",
		  remote_addr);

	mutex_lock_shared(&priv->usable_clients_mutex);
	mutex_lock(&priv->idle_workers_mutex);
	if (priv->usable_clients > 0 && priv->idle_workers_head != NULL) {
		worker = priv->idle_workers_head;
		priv->idle_workers_head = worker->next;
	}
	mutex_unlock(&priv->idle_workers_mutex);
	mutex_unlock_shared(&priv->usable_clients_mutex);

	if (worker == NULL) {
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Dropping client because there are no available slots.\n");
		ret = 0;
		goto conn_process_exit;
	}

	ret = proxy_worker_accept(worker, conn);
	if (ret < 0)
		goto conn_process_exit;

	return 0;

conn_process_exit:
	conn_free(conn);
	free(conn);

	return ret;
}